

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayStrideTests::init
          (SingleVertexArrayStrideTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  SingleVertexArrayStrideGroup *this_00;
  int local_2c;
  InputType IStack_28;
  int inputTypeNdx;
  InputType inputTypes [4];
  SingleVertexArrayStrideTests *this_local;
  
  _IStack_28 = 0x400000000;
  inputTypes[0] = INPUTTYPE_FIXED;
  inputTypes[1] = INPUTTYPE_INT_2_10_10_10;
  local_2c = 0;
  iVar1 = 1;
  while (local_2c < 4) {
    this_00 = (SingleVertexArrayStrideGroup *)operator_new(0x80);
    SingleVertexArrayStrideGroup::SingleVertexArrayStrideGroup
              (this_00,(this->super_TestCaseGroup).m_context,(&IStack_28)[local_2c]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_2c = local_2c + 1;
    iVar1 = local_2c;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayStrideTests::init (void)
{
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, /*Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE,*/ Array::INPUTTYPE_FIXED, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayStrideGroup(m_context, inputTypes[inputTypeNdx]));
	}
}